

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  bool bVar1;
  short sVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  BamAlignment *in_RSI;
  long in_RDI;
  float fVar11;
  char type;
  string tagName;
  size_t index;
  size_t tagDataLength;
  char *tagData;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarData;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int local_7c;
  string local_68 [32];
  ulong local_48;
  ulong local_40;
  long local_38;
  reference local_30;
  CigarOp *local_28;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_20;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_18;
  BamAlignment *local_10;
  
  local_10 = in_RSI;
  poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)in_RSI);
  poVar6 = std::operator<<(poVar6,'\t');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->AlignmentFlag);
  std::operator<<(poVar6,'\t');
  if ((local_10->RefID < 0) ||
     (iVar4 = local_10->RefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), (int)sVar7 <= iVar4)) {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  else {
    pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8),(long)local_10->RefID);
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)pvVar8);
    std::operator<<(poVar6,'\t');
  }
  poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_10->Position + 1);
  poVar6 = std::operator<<(poVar6,'\t');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->MapQuality);
  std::operator<<(poVar6,'\t');
  local_18 = &local_10->CigarData;
  bVar1 = std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::empty
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (bVar1) {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  else {
    local_20._M_current =
         (CigarOp *)
         std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                   (in_stack_fffffffffffffec8);
    local_28 = (CigarOp *)
               std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                         (in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                 ::operator*(&local_20);
      poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_30->Length);
      std::operator<<(poVar6,local_30->Type);
      __gnu_cxx::
      __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
      ::operator++(&local_20);
    }
    std::operator<<((ostream *)(in_RDI + 0x20),'\t');
  }
  bVar1 = BamAlignment::IsPaired(local_10);
  if (((bVar1) && (-1 < local_10->MateRefID)) &&
     (iVar4 = local_10->MateRefID,
     sVar7 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                       ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                        (in_RDI + 8)), iVar4 < (int)sVar7)) {
    if (local_10->MateRefID == local_10->RefID) {
      std::operator<<((ostream *)(in_RDI + 0x20),"=\t");
    }
    else {
      pvVar8 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator[]
                         ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                          (in_RDI + 8),(long)local_10->MateRefID);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)pvVar8);
      std::operator<<(poVar6,'\t');
    }
    poVar6 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x20),local_10->MatePosition + 1)
    ;
    poVar6 = std::operator<<(poVar6,'\t');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10->InsertSize);
    std::operator<<(poVar6,'\t');
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t0\t0\t");
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),(string *)&local_10->QueryBases);
    std::operator<<(poVar6,'\t');
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),"*\t");
  }
  uVar9 = std::__cxx11::string::empty();
  if (((uVar9 & 1) == 0) &&
     (pcVar10 = (char *)std::__cxx11::string::at((ulong)&local_10->Qualities), *pcVar10 != -1)) {
    std::operator<<((ostream *)(in_RDI + 0x20),(string *)&local_10->Qualities);
  }
  else {
    std::operator<<((ostream *)(in_RDI + 0x20),'*');
  }
  local_38 = std::__cxx11::string::c_str();
  local_40 = std::__cxx11::string::length();
  local_48 = 0;
  do {
    if (local_40 <= local_48) break;
    std::__cxx11::string::substr((ulong)local_68,(ulong)&local_10->TagData);
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),'\t');
    poVar6 = std::operator<<(poVar6,local_68);
    std::operator<<(poVar6,':');
    local_48 = local_48 + 2;
    pcVar10 = (char *)std::__cxx11::string::at((ulong)&local_10->TagData);
    local_48 = local_48 + 1;
    switch(*pcVar10) {
    case 'A':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"A:");
      std::operator<<(poVar6,*(char *)(local_38 + local_48));
      local_48 = local_48 + 1;
      break;
    case 'C':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      std::ostream::operator<<(poVar6,(short)*(char *)(local_38 + local_48));
      local_48 = local_48 + 1;
      break;
    case 'H':
    case 'Z':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),*pcVar10);
      std::operator<<(poVar6,':');
      for (; *(char *)(local_38 + local_48) != '\0'; local_48 = local_48 + 1) {
        std::operator<<((ostream *)(in_RDI + 0x20),*(char *)(local_38 + local_48));
      }
      local_48 = local_48 + 1;
      break;
    case 'I':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      uVar5 = UnpackUnsignedInt((char *)(local_38 + local_48));
      std::ostream::operator<<(poVar6,uVar5);
      local_48 = local_48 + 4;
      break;
    case 'S':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      uVar3 = UnpackUnsignedShort((char *)(local_38 + local_48));
      std::ostream::operator<<(poVar6,uVar3);
      local_48 = local_48 + 2;
      break;
    case 'c':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      std::ostream::operator<<(poVar6,(short)*(char *)(local_38 + local_48));
      local_48 = local_48 + 1;
      break;
    case 'f':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"f:");
      fVar11 = UnpackFloat((char *)(local_38 + local_48));
      std::ostream::operator<<(poVar6,fVar11);
      local_48 = local_48 + 4;
      break;
    case 'i':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      iVar4 = UnpackSignedInt((char *)(local_38 + local_48));
      std::ostream::operator<<(poVar6,iVar4);
      local_48 = local_48 + 4;
      break;
    case 's':
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x20),"i:");
      sVar2 = UnpackSignedShort((char *)(local_38 + local_48));
      std::ostream::operator<<(poVar6,sVar2);
      local_48 = local_48 + 2;
    }
    if (*(char *)(local_38 + local_48) == '\0') {
      local_7c = 6;
    }
    else {
      local_7c = 0;
    }
    std::__cxx11::string::~string(local_68);
  } while (local_7c == 0);
  std::ostream::operator<<((void *)(in_RDI + 0x20),std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size()))
        m_out << m_references[a.RefID].RefName << '\t';
    else
        m_out << "*\t";

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty())
        m_out << "*\t";
    else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID)
            m_out << "=\t";
        else
            m_out << m_references[a.MateRefID].RefName << '\t';
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else
        m_out << "*\t0\t0\t";

    // write sequence
    if (a.QueryBases.empty())
        m_out << "*\t";
    else
        m_out << a.QueryBases << '\t';

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF))
        m_out << '*';
    else
        m_out << a.Qualities;

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<int16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << static_cast<uint16_t>(tagData[index]);
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;
        }

        if (tagData[index] == '\0') break;
    }

    m_out << std::endl;
}